

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  size_t sVar1;
  Impl *this_00;
  String *pSVar2;
  Own<const_kj::ReadableDirectory> *pOVar3;
  ReadableDirectory *pRVar4;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar5;
  StringPtr name;
  PathPtr PVar6;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar7;
  StringPtr local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  OwnOwn<const_kj::ReadableDirectory> subdir;
  ArrayPtr<const_char> local_70;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_60;
  EntryImpl *local_58;
  EntryImpl *entry;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_30;
  Fault f;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  this_local = (InMemoryDirectory *)path.parts.size_;
  name.content.ptr = (Exception *)path.parts.ptr;
  f.exception = name.content.ptr;
  path_local.parts.size_ = (size_t)this;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x42f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&local_30);
    pRVar5 = extraout_RDX;
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      this_00 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                          ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                           &entry);
      pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&local_70,pSVar2);
      local_60 = Impl::tryGetEntry(this_00,(StringPtr)local_70);
      local_58 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                           (&local_60);
      if (local_58 == (EntryImpl *)0x0) {
        Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,(void *)0x0);
      }
      else {
        asFile(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                    name.content.ptr,(EntryImpl *)&entry);
      }
      subdir.value.ptr._4_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pRVar5 = extraout_RDX_00;
    }
    else {
      pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_a8,pSVar2);
      name.content.size_ = (size_t)local_a8.content.ptr;
      tryGetParent((InMemoryDirectory *)local_98,name);
      kj::_::readMaybe<kj::ReadableDirectory_const>
                ((_ *)local_88,(Maybe<kj::Own<const_kj::ReadableDirectory>_> *)local_98);
      Maybe<kj::Own<const_kj::ReadableDirectory>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory>_> *)local_98);
      pOVar3 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_88);
      if (pOVar3 == (Own<const_kj::ReadableDirectory> *)0x0) {
        Maybe<kj::Own<const_kj::ReadableFile>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableFile>_> *)this,(void *)0x0);
      }
      else {
        pOVar3 = kj::_::OwnOwn<const_kj::ReadableDirectory>::operator->
                           ((OwnOwn<const_kj::ReadableDirectory> *)local_88);
        pRVar4 = Own<const_kj::ReadableDirectory>::get(pOVar3);
        sVar1 = PathPtr::size((PathPtr *)&this_local);
        PVar6 = PathPtr::slice((PathPtr *)&this_local,1,sVar1);
        (*(pRVar4->super_FsNode)._vptr_FsNode[10])(this,pRVar4,PVar6.parts.ptr,PVar6.parts.size_);
      }
      subdir.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory> *)local_88);
      pRVar5 = extraout_RDX_01;
    }
  }
  MVar7.ptr.ptr = pRVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, *entry);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->tryOpenFile(path.slice(1, path.size()));
      } else {
        return nullptr;
      }
    }
  }